

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O2

HydroProp * __thiscall OpenMD::Ellipsoid::getHydroProp(Ellipsoid *this,RealType viscosity)

{
  HydroProp *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Mat6x6d Xi;
  string local_290 [32];
  Vector<double,_3U> local_270;
  RectMatrix<double,_6U,_6U> local_258;
  RectMatrix<double,_6U,_6U> local_138;
  
  dVar7 = this->rAxial_;
  dVar2 = this->rEquatorial_;
  dVar3 = dVar7 * dVar7;
  dVar5 = dVar2 * dVar2;
  if (dVar7 / dVar2 <= 1.0) {
    dVar1 = dVar5 - dVar3;
    dVar6 = SQRT(dVar1);
    dVar2 = dVar6;
    if (dVar1 < 0.0) {
      dVar2 = sqrt(dVar1);
    }
    if (dVar1 < 0.0) {
      dVar6 = sqrt(dVar1);
    }
    dVar6 = atan(dVar6 / dVar7);
    dVar6 = (2.0 / dVar2) * dVar6;
  }
  else {
    dVar4 = dVar3 - dVar5;
    dVar6 = SQRT(dVar4);
    dVar1 = dVar6;
    if (dVar4 < 0.0) {
      dVar1 = sqrt(dVar4);
    }
    if (dVar4 < 0.0) {
      dVar6 = sqrt(dVar4);
    }
    dVar6 = log((dVar6 + dVar7) / dVar2);
    dVar6 = (2.0 / dVar1) * dVar6;
  }
  dVar2 = dVar3 - dVar5;
  dVar7 = dVar7 + dVar7;
  dVar1 = ((dVar3 + dVar3) - dVar5) * dVar6 - dVar7;
  dVar4 = (viscosity * 100.53096491487338 * dVar2) /
          ((dVar5 * -3.0 + dVar3 + dVar3) * dVar6 + dVar7);
  dVar3 = ((dVar3 * dVar3 - dVar5 * dVar5) * viscosity * 33.510321638291124) / dVar1;
  SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)&local_258);
  local_258.data_[0][0] = dVar4;
  local_258.data_[1][1] = dVar4;
  local_258.data_[2][2] = (viscosity * 50.26548245743669 * dVar2) / dVar1;
  local_258.data_[3][3] = dVar3;
  local_258.data_[4][4] = dVar3;
  local_258.data_[5][5] = (dVar2 * viscosity * 33.510321638291124 * dVar5) / (dVar7 - dVar6 * dVar5)
  ;
  RectMatrix<double,_6U,_6U>::mul(&local_258,14393.26479);
  this_00 = (HydroProp *)operator_new(0x280);
  Vector<double,_3U>::Vector(&local_270,(Vector<double,_3U> *)OpenMD::V3Zero);
  RectMatrix<double,_6U,_6U>::operator=(&local_138,&local_258);
  HydroProp::HydroProp(this_00,(Vector3d *)&local_270,(Mat6x6d *)&local_138);
  std::__cxx11::string::string(local_290,(string *)&(this->super_Shape).name_);
  std::__cxx11::string::_M_assign((string *)this_00);
  std::__cxx11::string::~string(local_290);
  return this_00;
}

Assistant:

HydroProp* Ellipsoid::getHydroProp(RealType viscosity) {
    RealType a  = rAxial_;
    RealType b  = rEquatorial_;
    RealType a2 = a * a;
    RealType b2 = b * b;

    RealType p = a / b;
    RealType S;
    if (p > 1.0) {
      // Ellipsoid is prolate:
      S = 2.0 / sqrt(a2 - b2) * log((a + sqrt(a2 - b2)) / b);
    } else {
      // Ellipsoid is oblate:
      S = 2.0 / sqrt(b2 - a2) * atan(sqrt(b2 - a2) / a);
    }

    RealType pi = Constants::PI;
    RealType XittA =
        16.0 * pi * viscosity * (a2 - b2) / ((2.0 * a2 - b2) * S - 2.0 * a);
    RealType XittB = 32.0 * pi * viscosity * (a2 - b2) /
                     ((2.0 * a2 - 3.0 * b2) * S + 2.0 * a);
    RealType XirrA =
        32.0 / 3.0 * pi * viscosity * (a2 - b2) * b2 / (2.0 * a - b2 * S);
    RealType XirrB = 32.0 / 3.0 * pi * viscosity * (a2 * a2 - b2 * b2) /
                     ((2.0 * a2 - b2) * S - 2.0 * a);

    Mat6x6d Xi;

    Xi(0, 0) = XittB;
    Xi(1, 1) = XittB;
    Xi(2, 2) = XittA;
    Xi(3, 3) = XirrB;
    Xi(4, 4) = XirrB;
    Xi(5, 5) = XirrA;

    Xi *= Constants::viscoConvert;

    HydroProp* hprop = new HydroProp(V3Zero, Xi);
    hprop->setName(getName());

    return hprop;
  }